

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

TypedExpectation<test_result_(int)> * __thiscall
testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
          (MockSpec<test_result_(int)> *this,char *file,int line,char *obj,char *call)

{
  TypedExpectation<test_result_(int)> *pTVar1;
  string *in_stack_000000b8;
  int in_stack_000000c4;
  char *in_stack_000000c8;
  LogSeverity in_stack_000000d4;
  string source_text;
  char *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  char *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  allocator local_c9;
  string local_c8 [8];
  ArgumentMatcherTuple *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  FunctionMockerBase<test_result_(int)> *in_stack_ffffffffffffff60;
  string local_88 [32];
  string local_68 [32];
  string local_48 [72];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"EXPECT_CALL(",&local_c9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  LogWithLocation(in_stack_000000d4,in_stack_000000c8,in_stack_000000c4,in_stack_000000b8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
  pTVar1 = FunctionMockerBase<test_result_(int)>::AddNewExpectation
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                      in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_48);
  return pTVar1;
}

Assistant:

internal::TypedExpectation<F>& InternalExpectedAt(
      const char* file, int line, const char* obj, const char* call) {
    const string source_text(string("EXPECT_CALL(") + obj + ", " + call + ")");
    LogWithLocation(internal::kInfo, file, line, source_text + " invoked");
    return function_mocker_->AddNewExpectation(
        file, line, source_text, matchers_);
  }